

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SNICallback_Test::TestBody
          (SSLVersionTest_SNICallback_Test *this)

{
  UniquePtr<SSL> *out_client;
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  pointer *__ptr_1;
  UniquePtr<X509> peer;
  UniquePtr<SSL_CTX> server_ctx2;
  UniquePtr<EVP_PKEY> key2;
  uint8_t *data;
  UniquePtr<X509> cert2;
  size_t len;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_d0;
  Bytes local_c8;
  undefined1 local_b8 [8];
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Head_base<0UL,_x509_st_*,_false> local_78;
  _Head_base<0UL,_evp_pkey_st_*,_false> _Stack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  _Head_base<0UL,_x509_st_*,_false> local_40;
  size_t local_38;
  
  BufferFromPEM((anon_unknown_0 *)local_a8,
                "-----BEGIN CERTIFICATE-----\nMIIBzzCCAXagAwIBAgIJANlMBNpJfb/rMAkGByqGSM49BAEwRTELMAkGA1UEBhMC\nQVUxEzARBgNVBAgMClNvbWUtU3RhdGUxITAfBgNVBAoMGEludGVybmV0IFdpZGdp\ndHMgUHR5IEx0ZDAeFw0xNDA0MjMyMzIxNTdaFw0xNDA1MjMyMzIxNTdaMEUxCzAJ\nBgNVBAYTAkFVMRMwEQYDVQQIDApTb21lLVN0YXRlMSEwHwYDVQQKDBhJbnRlcm5l\ndCBXaWRnaXRzIFB0eSBMdGQwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAATmK2ni\nv2Wfl74vHg2UikzVl2u3qR4NRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYa\nHPUdfvGULUvPciLBo1AwTjAdBgNVHQ4EFgQUq4TSrKuV8IJOFngHVVdf5CaNgtEw\nHwYDVR0jBBgwFoAUq4TSrKuV8IJOFngHVVdf5CaNgtEwDAYDVR0TBAUwAwEB/zAJ\nBgcqhkjOPQQBA0gAMEUCIQDyoDVeUTo2w4J5m+4nUIWOcAZ0lVfSKXQA9L4Vh13E\nBwIgfB55FGohg/B6dGh5XxSZmmi08cueFV7mHzJSYV51yRQ=\n-----END CERTIFICATE-----\n"
               );
  X509FromBuffer((anon_unknown_0 *)&local_40,(UniquePtr<CRYPTO_BUFFER> *)local_a8);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)local_a8);
  local_e0[0] = (internal)((X509 *)local_40._M_head_impl != (X509 *)0x0);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((X509 *)local_40._M_head_impl == (X509 *)0x0) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_e0,(AssertionResult *)0x33698d,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xfe0,(char *)local_a8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_c8.span_.data_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8.span_.data_ + 8))();
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    goto LAB_00185771;
  }
  KeyFromPEM((anon_unknown_0 *)&local_b0,
             "-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
            );
  local_e0[0] = (internal)
                (local_b0._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_b0._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_e0,(AssertionResult *)"key2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xfe2,(char *)local_a8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_c8.span_.data_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8.span_.data_ + 8))();
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
  }
  else {
    SSLVersionTest::CreateContext((SSLVersionTest *)local_b8);
    local_e0[0] = (internal)
                  ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)local_b8 !=
                  (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)local_b8 ==
        (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)local_e0,(AssertionResult *)"server_ctx2","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xfeb,(char *)local_a8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_c8);
LAB_00185716:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
      if (local_a8 != (undefined1  [8])&local_98) {
        operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
      }
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_c8.span_.data_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8.span_.data_ + 8))();
      }
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_00185758:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,local_d8);
      }
    }
    else {
      iVar2 = SSL_CTX_use_certificate((SSL_CTX *)local_b8,(X509 *)local_40._M_head_impl);
      local_e0[0] = (internal)(iVar2 != 0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_e0,
                   (AssertionResult *)"SSL_CTX_use_certificate(server_ctx2.get(), cert2.get())",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xfec,(char *)local_a8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_c8);
        goto LAB_00185716;
      }
      iVar2 = SSL_CTX_use_PrivateKey
                        ((SSL_CTX *)local_b8,
                         (EVP_PKEY *)
                         local_b0._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
      local_e0[0] = (internal)(iVar2 != 0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_e0,
                   (AssertionResult *)"SSL_CTX_use_PrivateKey(server_ctx2.get(), key2.get())",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xfed,(char *)local_a8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_c8);
        goto LAB_00185716;
      }
      iVar2 = SSL_CTX_set_signed_cert_timestamp_list((SSL_CTX *)local_b8,"",8);
      local_e0[0] = (internal)(iVar2 != 0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_e0,
                   (AssertionResult *)
                   "SSL_CTX_set_signed_cert_timestamp_list( server_ctx2.get(), kSCTList, sizeof(kSCTList))"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xfef,(char *)local_a8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_c8);
        goto LAB_00185716;
      }
      iVar2 = SSL_CTX_set_ocsp_response((SSL_CTX *)local_b8,"\x01\x02\x03\x04",4);
      local_e0[0] = (internal)(iVar2 != 0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_e0,
                   (AssertionResult *)
                   "SSL_CTX_set_ocsp_response(server_ctx2.get(), kOCSPResponse, sizeof(kOCSPResponse))"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xff1,(char *)local_a8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_c8);
        goto LAB_00185716;
      }
      iVar2 = SSL_CTX_set_signing_algorithm_prefs((SSL_CTX *)local_b8,&TestBody::kECDSAWithSHA256,1)
      ;
      local_e0[0] = (internal)(iVar2 != 0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_e0,
                   (AssertionResult *)
                   "SSL_CTX_set_signing_algorithm_prefs(server_ctx2.get(), &kECDSAWithSHA256, 1)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xff7,(char *)local_a8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_c8);
        goto LAB_00185716;
      }
      SSL_CTX_set_tlsext_servername_callback
                ((this->super_SSLVersionTest).server_ctx_._M_t.
                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,SwitchContext);
      SSL_CTX_set_tlsext_servername_arg
                ((this->super_SSLVersionTest).server_ctx_._M_t.
                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,(void *)local_b8);
      SSL_CTX_enable_signed_cert_timestamps
                ((this->super_SSLVersionTest).client_ctx_._M_t.
                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      SSL_CTX_enable_ocsp_stapling
                ((this->super_SSLVersionTest).client_ctx_._M_t.
                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
      local_98._8_8_ = (ssl_st *)0x0;
      local_88._8_8_ = (ssl_ctx_st *)0x0;
      _Stack_70._M_head_impl = (evp_pkey_st *)0x0;
      local_68._8_8_ = 0;
      local_a8 = (undefined1  [8])0x0;
      pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_88._M_allocated_capacity = 0;
      local_68._M_allocated_capacity = 0;
      local_58._0_4_ = 0;
      local_58._4_1_ = false;
      local_58._5_3_ = 0;
      out_client = &(this->super_SSLVersionTest).client_;
      bVar1 = (this->super_SSLVersionTest).shed_handshake_config_;
      pcVar3 = (char *)(ulong)bVar1;
      local_98._M_allocated_capacity = (size_type)(ssl_st *)&local_88;
      local_78._M_head_impl = (x509_st *)&local_68;
      bVar1 = ConnectClientAndServer
                        (out_client,&(this->super_SSLVersionTest).server_,
                         (this->super_SSLVersionTest).client_ctx_._M_t.
                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                         (this->super_SSLVersionTest).server_ctx_._M_t.
                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                         (ClientConfig *)local_a8,bVar1);
      local_e0[0] = (internal)bVar1;
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_head_impl != &local_68) {
        operator_delete(local_78._M_head_impl,local_68._M_allocated_capacity + 1);
      }
      if ((ssl_st *)local_98._M_allocated_capacity != (ssl_st *)&local_88) {
        operator_delete((void *)local_98._M_allocated_capacity,
                        (ulong)(local_88._M_allocated_capacity + 1));
      }
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_e0,(AssertionResult *)"Connect()","false",
                   "true",pcVar3);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xfff,(char *)local_a8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
        if (local_a8 != (undefined1  [8])&local_98) {
          operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_c8.span_.data_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_c8.span_.data_ + 8))();
        }
        if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_0018575d;
        goto LAB_00185758;
      }
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,local_d8);
      }
      local_d0._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
           SSL_get_peer_certificate
                     ((SSL *)(out_client->_M_t).
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      local_e0[0] = (internal)
                    ((tuple<x509_st_*,_bssl::internal::Deleter>)
                     local_d0._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
                    (_Head_base<0UL,_x509_st_*,_false>)0x0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((tuple<x509_st_*,_bssl::internal::Deleter>)
          local_d0._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_x509_st_*,_false>)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8;
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_e0,(AssertionResult *)"peer","false","true",
                   pcVar3);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1003,(char *)local_a8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
        if (local_a8 != (undefined1  [8])&local_98) {
          operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_c8.span_.data_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_c8.span_.data_ + 8))();
        }
        __ptr_00 = local_d8;
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_00185afe;
      }
      else {
        iVar2 = X509_cmp((X509 *)local_d0._M_t.
                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                         (X509 *)local_40._M_head_impl);
        local_e0._0_4_ = iVar2;
        local_c8.span_.data_ = (uchar *)((ulong)local_c8.span_.data_ & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_a8,"X509_cmp(peer.get(), cert2.get())","0",(int *)local_e0,
                   (int *)&local_c8);
        if (local_a8[0] == (anon_unknown_0)0x0) {
          testing::Message::Message((Message *)local_e0);
          if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar3 = "";
          }
          else {
            pcVar3 = (pbStack_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1004,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
          if (local_e0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_e0 + 8))();
          }
        }
        if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_a0,pbStack_a0);
        }
        SSL_get0_signed_cert_timestamp_list
                  ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                   &local_38);
        local_e0 = (undefined1  [8])0x32bc9e;
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
        local_c8.span_.data_ = (uchar *)local_48._M_head_impl;
        local_c8.span_.size_ = local_38;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_a8,"Bytes(kSCTList)","Bytes(data, len)",(Bytes *)local_e0,
                   &local_c8);
        if (local_a8[0] == (anon_unknown_0)0x0) {
          testing::Message::Message((Message *)local_e0);
          if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar3 = "";
          }
          else {
            pcVar3 = (pbStack_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x100a,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
          if (local_e0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_e0 + 8))();
          }
        }
        if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_a0,pbStack_a0);
        }
        SSL_get0_ocsp_response
                  ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(uint8_t **)&local_48,
                   &local_38);
        local_e0 = (undefined1  [8])0x32bca6;
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &DAT_00000004;
        local_c8.span_.data_ = (uchar *)local_48._M_head_impl;
        local_c8.span_.size_ = local_38;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_a8,"Bytes(kOCSPResponse)","Bytes(data, len)",(Bytes *)local_e0,
                   &local_c8);
        if (local_a8[0] == (anon_unknown_0)0x0) {
          testing::Message::Message((Message *)local_e0);
          if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar3 = "";
          }
          else {
            pcVar3 = (pbStack_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x100e,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
          if (local_e0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_e0 + 8))();
          }
        }
        if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&pbStack_a0;
          __ptr_00 = pbStack_a0;
LAB_00185afe:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(this_00,__ptr_00);
        }
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_d0);
    }
LAB_0018575d:
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)local_b8);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_b0);
LAB_00185771:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SNICallback) {
  bssl::UniquePtr<X509> cert2 = GetECDSATestCertificate();
  ASSERT_TRUE(cert2);
  bssl::UniquePtr<EVP_PKEY> key2 = GetECDSATestKey();
  ASSERT_TRUE(key2);

  // Test that switching the |SSL_CTX| at the SNI callback behaves correctly.
  static const uint16_t kECDSAWithSHA256 = SSL_SIGN_ECDSA_SECP256R1_SHA256;

  static const uint8_t kSCTList[] = {0, 6, 0, 4, 5, 6, 7, 8};
  static const uint8_t kOCSPResponse[] = {1, 2, 3, 4};

  bssl::UniquePtr<SSL_CTX> server_ctx2 = CreateContext();
  ASSERT_TRUE(server_ctx2);
  ASSERT_TRUE(SSL_CTX_use_certificate(server_ctx2.get(), cert2.get()));
  ASSERT_TRUE(SSL_CTX_use_PrivateKey(server_ctx2.get(), key2.get()));
  ASSERT_TRUE(SSL_CTX_set_signed_cert_timestamp_list(
      server_ctx2.get(), kSCTList, sizeof(kSCTList)));
  ASSERT_TRUE(SSL_CTX_set_ocsp_response(server_ctx2.get(), kOCSPResponse,
                                        sizeof(kOCSPResponse)));
  // Historically signing preferences would be lost in some cases with the
  // SNI callback, which triggers the TLS 1.2 SHA-1 default. To ensure
  // this doesn't happen when |version| is TLS 1.2, configure the private
  // key to only sign SHA-256.
  ASSERT_TRUE(SSL_CTX_set_signing_algorithm_prefs(server_ctx2.get(),
                                                  &kECDSAWithSHA256, 1));

  SSL_CTX_set_tlsext_servername_callback(server_ctx_.get(), SwitchContext);
  SSL_CTX_set_tlsext_servername_arg(server_ctx_.get(), server_ctx2.get());

  SSL_CTX_enable_signed_cert_timestamps(client_ctx_.get());
  SSL_CTX_enable_ocsp_stapling(client_ctx_.get());

  ASSERT_TRUE(Connect());

  // The client should have received |cert2|.
  bssl::UniquePtr<X509> peer(SSL_get_peer_certificate(client_.get()));
  ASSERT_TRUE(peer);
  EXPECT_EQ(X509_cmp(peer.get(), cert2.get()), 0);

  // The client should have received |server_ctx2|'s SCT list.
  const uint8_t *data;
  size_t len;
  SSL_get0_signed_cert_timestamp_list(client_.get(), &data, &len);
  EXPECT_EQ(Bytes(kSCTList), Bytes(data, len));

  // The client should have received |server_ctx2|'s OCSP response.
  SSL_get0_ocsp_response(client_.get(), &data, &len);
  EXPECT_EQ(Bytes(kOCSPResponse), Bytes(data, len));
}